

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

int CBS_get_optional_asn1_bool(CBS *cbs,int *out,CBS_ASN1_TAG tag,int default_value)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int present;
  CBS child2;
  CBS child;
  
  iVar1 = CBS_get_optional_asn1(cbs,&child,&present,tag);
  iVar2 = 0;
  if (iVar1 != 0) {
    if (present != 0) {
      iVar1 = CBS_get_asn1(&child,&child2,1);
      if (iVar1 == 0) {
        return 0;
      }
      if (child2.len != 1) {
        return 0;
      }
      if (child.len != 0) {
        return 0;
      }
      default_value = (int)*child2.data;
      if ((*child2.data != 0) && (bVar3 = default_value != 0xff, default_value = 1, bVar3)) {
        return 0;
      }
    }
    iVar2 = 1;
    *out = default_value;
  }
  return iVar2;
}

Assistant:

int CBS_get_optional_asn1_bool(CBS *cbs, int *out, CBS_ASN1_TAG tag,
                               int default_value) {
  CBS child, child2;
  int present;
  if (!CBS_get_optional_asn1(cbs, &child, &present, tag)) {
    return 0;
  }
  if (present) {
    uint8_t boolean;

    if (!CBS_get_asn1(&child, &child2, CBS_ASN1_BOOLEAN) ||
        CBS_len(&child2) != 1 || CBS_len(&child) != 0) {
      return 0;
    }

    boolean = CBS_data(&child2)[0];
    if (boolean == 0) {
      *out = 0;
    } else if (boolean == 0xff) {
      *out = 1;
    } else {
      return 0;
    }
  } else {
    *out = default_value;
  }
  return 1;
}